

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  uint *puVar4;
  undefined4 *puVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  float *ptr;
  uint uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  int iVar14;
  uint uVar15;
  undefined1 (*pauVar16) [32];
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  
  auVar6 = _DAT_00515be0;
  auVar24 = _DAT_00515bc0;
  iVar10 = bottom_top_blob->elempack;
  iVar14 = bottom_top_blob->dims;
  iVar20 = bottom_top_blob->w;
  uVar17 = bottom_top_blob->h;
  auVar28 = in_ZMM5._0_16_;
  if (iVar14 == 3) {
    uVar11 = bottom_top_blob->c;
    if (0 < (int)uVar11) {
      uVar17 = iVar20 * iVar10 * uVar17;
      pp_Var2 = this->_vptr_PReLU_x86_fma;
      uVar19 = 0;
      auVar41 = ZEXT816(0);
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar28 = vpcmpeqd_avx(auVar28,auVar28);
      auVar31._8_4_ = 0xffff;
      auVar31._0_8_ = 0xffff0000ffff;
      auVar31._12_4_ = 0xffff;
      auVar31._16_4_ = 0xffff;
      auVar31._20_4_ = 0xffff;
      auVar31._24_4_ = 0xffff;
      auVar31._28_4_ = 0xffff;
      do {
        puVar5 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var2[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) < 2) {
          uVar1 = *puVar5;
          auVar58._4_4_ = uVar1;
          auVar58._0_4_ = uVar1;
          auVar58._8_4_ = uVar1;
          auVar58._12_4_ = uVar1;
          auVar35 = auVar58;
LAB_00336e40:
          auVar25 = auVar35;
          auVar37._16_16_ = auVar58;
          auVar37._0_16_ = auVar58;
        }
        else {
          uVar22 = puVar5[uVar19];
          auVar25 = ZEXT416(uVar22);
          auVar35 = ZEXT416(uVar22);
          if (iVar10 == 4) {
            auVar58 = *(undefined1 (*) [16])(puVar5 + uVar19 * 4);
            goto LAB_00336e40;
          }
          auVar58 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
          if (iVar10 != 8) goto LAB_00336e40;
          auVar37 = *(undefined1 (*) [32])(puVar5 + uVar19 * 8);
        }
        pauVar13 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar22 = 0;
        if (7 < (int)uVar17) {
          iVar14 = 7;
          do {
            auVar51 = vmaxps_avx(*pauVar13,ZEXT1632(auVar41));
            auVar7 = vminps_avx(*pauVar13,ZEXT1632(auVar41));
            auVar35 = vfmadd213ps_fma(auVar7,auVar37,auVar51);
            *pauVar13 = ZEXT1632(auVar35);
            pauVar13 = pauVar13 + 1;
            iVar14 = iVar14 + 8;
            uVar22 = uVar17 & 0xfffffff8;
          } while (iVar14 < (int)uVar17);
        }
        uVar15 = uVar22 | 3;
        while ((int)uVar15 < (int)uVar17) {
          auVar35 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar33 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar35 = vfmadd213ps_fma(auVar33,auVar58,auVar35);
          *(undefined1 (*) [16])*pauVar13 = auVar35;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar15 = uVar22 + 7;
          uVar22 = uVar22 + 4;
        }
        if ((int)uVar22 < (int)uVar17) {
          uVar12 = CONCAT44(0,~uVar22 + uVar17);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar12;
          auVar33 = vpshufd_avx(auVar35,0x44);
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar58 = vorps_avx(auVar33,auVar26);
          auVar35 = vorps_avx(auVar33,auVar26);
          uVar23 = 0;
          do {
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar23;
            auVar46 = vpshufd_avx(auVar46,0x44);
            auVar51._16_16_ = auVar46;
            auVar51._0_16_ = auVar46;
            auVar37 = vorps_avx(auVar51,auVar24);
            auVar51 = vorps_avx(auVar51,auVar6);
            auVar46 = vorps_avx(auVar33,auVar26);
            auVar61._0_8_ = auVar51._16_8_ ^ 0x8000000000000000;
            auVar61._8_4_ = auVar51._24_4_;
            auVar61._12_4_ = auVar51._28_4_ ^ 0x80000000;
            auVar61 = vpcmpgtq_avx(auVar61,auVar46);
            auVar47._0_8_ = auVar51._0_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar51._8_4_;
            auVar47._12_4_ = auVar51._12_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar47,auVar58);
            auVar61 = vpackssdw_avx(auVar47,auVar61);
            auVar64._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
            auVar64._8_4_ = auVar37._24_4_;
            auVar64._12_4_ = auVar37._28_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar64,auVar46);
            auVar55._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
            auVar55._8_4_ = auVar37._8_4_;
            auVar55._12_4_ = auVar37._12_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar55,auVar35);
            auVar46 = vpackssdw_avx(auVar47,auVar46);
            auVar46 = vpackssdw_avx(auVar46 ^ auVar28,auVar61 ^ auVar28);
            auVar61 = vpmovsxwd_avx(auVar46);
            auVar47 = vpunpckhwd_avx(auVar46,auVar46);
            auVar60._16_16_ = auVar47;
            auVar60._0_16_ = auVar61;
            auVar51 = vmaskmovps_avx(auVar60,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar37 = vcmpps_avx(auVar51,ZEXT1632(auVar41),1);
            auVar37 = vandps_avx(auVar37,auVar31);
            auVar61 = vpackusdw_avx(auVar37._0_16_,auVar37._16_16_);
            auVar46 = vpand_avx(auVar46,auVar61);
            auVar61 = vpmovzxwd_avx(auVar46);
            auVar61 = vpslld_avx(auVar61,0x1f);
            auVar46 = vpunpckhwd_avx(auVar46,auVar46);
            auVar46 = vpslld_avx(auVar46,0x1f);
            auVar52._16_16_ = auVar46;
            auVar52._0_16_ = auVar61;
            auVar7._4_4_ = auVar51._4_4_ * auVar25._4_4_;
            auVar7._0_4_ = auVar51._0_4_ * auVar25._0_4_;
            auVar7._8_4_ = auVar51._8_4_ * auVar25._8_4_;
            auVar7._12_4_ = auVar51._12_4_ * auVar25._12_4_;
            auVar7._16_4_ = auVar51._16_4_ * auVar25._0_4_;
            auVar7._20_4_ = auVar51._20_4_ * auVar25._4_4_;
            auVar7._24_4_ = auVar51._24_4_ * auVar25._8_4_;
            auVar7._28_4_ = auVar51._28_4_;
            auVar37 = vmaskmovps_avx(auVar52,auVar7);
            *(undefined1 (*) [32])(*pauVar13 + uVar23 * 4) = auVar37;
            uVar23 = uVar23 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar23);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar11);
    }
  }
  else if (iVar14 == 2) {
    if (0 < (int)uVar17) {
      uVar11 = iVar20 * iVar10;
      pp_Var2 = this->_vptr_PReLU_x86_fma;
      uVar19 = 0;
      auVar41 = ZEXT816(0);
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      auVar28 = vpcmpeqd_avx(auVar28,auVar28);
      auVar30._8_4_ = 0xffff;
      auVar30._0_8_ = 0xffff0000ffff;
      auVar30._12_4_ = 0xffff;
      auVar30._16_4_ = 0xffff;
      auVar30._20_4_ = 0xffff;
      auVar30._24_4_ = 0xffff;
      auVar30._28_4_ = 0xffff;
      do {
        puVar5 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var2[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) < 2) {
          uVar1 = *puVar5;
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar26 = auVar33;
LAB_00336bf9:
          auVar58 = auVar26;
          auVar36._16_16_ = auVar33;
          auVar36._0_16_ = auVar33;
        }
        else {
          uVar22 = puVar5[uVar19];
          auVar58 = ZEXT416(uVar22);
          auVar26 = ZEXT416(uVar22);
          if (iVar10 == 4) {
            auVar33 = *(undefined1 (*) [16])(puVar5 + uVar19 * 4);
            goto LAB_00336bf9;
          }
          auVar33 = vshufps_avx(ZEXT416(uVar22),ZEXT416(uVar22),0);
          if (iVar10 != 8) goto LAB_00336bf9;
          auVar36 = *(undefined1 (*) [32])(puVar5 + uVar19 * 8);
        }
        pauVar13 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar19 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar22 = 0;
        if (7 < (int)uVar11) {
          iVar14 = 7;
          do {
            auVar31 = vmaxps_avx(*pauVar13,ZEXT1632(auVar41));
            auVar37 = vminps_avx(*pauVar13,ZEXT1632(auVar41));
            auVar26 = vfmadd213ps_fma(auVar37,auVar36,auVar31);
            *pauVar13 = ZEXT1632(auVar26);
            pauVar13 = pauVar13 + 1;
            iVar14 = iVar14 + 8;
            uVar22 = uVar11 & 0xfffffff8;
          } while (iVar14 < (int)uVar11);
        }
        uVar15 = uVar22 | 3;
        while ((int)uVar15 < (int)uVar11) {
          auVar26 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar35 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar26 = vfmadd213ps_fma(auVar35,auVar33,auVar26);
          *(undefined1 (*) [16])*pauVar13 = auVar26;
          pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
          uVar15 = uVar22 + 7;
          uVar22 = uVar22 + 4;
        }
        if ((int)uVar22 < (int)uVar11) {
          uVar12 = CONCAT44(0,~uVar22 + uVar11);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar12;
          auVar35 = vpshufd_avx(auVar34,0x44);
          auVar33 = vshufps_avx(auVar58,auVar58,0);
          auVar26 = vorps_avx(auVar35,auVar25);
          auVar58 = vorps_avx(auVar35,auVar25);
          uVar23 = 0;
          do {
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar23;
            auVar46 = vpshufd_avx(auVar44,0x44);
            auVar49._16_16_ = auVar46;
            auVar49._0_16_ = auVar46;
            auVar31 = vorps_avx(auVar49,auVar24);
            auVar37 = vorps_avx(auVar49,auVar6);
            auVar46 = vorps_avx(auVar35,auVar25);
            auVar62._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
            auVar62._8_4_ = auVar37._24_4_;
            auVar62._12_4_ = auVar37._28_4_ ^ 0x80000000;
            auVar61 = vpcmpgtq_avx(auVar62,auVar46);
            auVar45._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
            auVar45._8_4_ = auVar37._8_4_;
            auVar45._12_4_ = auVar37._12_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar45,auVar26);
            auVar61 = vpackssdw_avx(auVar47,auVar61);
            auVar63._0_8_ = auVar31._16_8_ ^ 0x8000000000000000;
            auVar63._8_4_ = auVar31._24_4_;
            auVar63._12_4_ = auVar31._28_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar63,auVar46);
            auVar54._0_8_ = auVar31._0_8_ ^ 0x8000000000000000;
            auVar54._8_4_ = auVar31._8_4_;
            auVar54._12_4_ = auVar31._12_4_ ^ 0x80000000;
            auVar47 = vpcmpgtq_avx(auVar54,auVar58);
            auVar46 = vpackssdw_avx(auVar47,auVar46);
            auVar46 = vpackssdw_avx(auVar46 ^ auVar28,auVar61 ^ auVar28);
            auVar61 = vpmovsxwd_avx(auVar46);
            auVar47 = vpunpckhwd_avx(auVar46,auVar46);
            auVar59._16_16_ = auVar47;
            auVar59._0_16_ = auVar61;
            auVar37 = vmaskmovps_avx(auVar59,*(undefined1 (*) [32])(*pauVar13 + uVar23 * 4));
            auVar31 = vcmpps_avx(auVar37,ZEXT1632(auVar41),1);
            auVar31 = vandps_avx(auVar31,auVar30);
            auVar61 = vpackusdw_avx(auVar31._0_16_,auVar31._16_16_);
            auVar46 = vpand_avx(auVar46,auVar61);
            auVar61 = vpmovzxwd_avx(auVar46);
            auVar61 = vpslld_avx(auVar61,0x1f);
            auVar46 = vpunpckhwd_avx(auVar46,auVar46);
            auVar46 = vpslld_avx(auVar46,0x1f);
            auVar50._16_16_ = auVar46;
            auVar50._0_16_ = auVar61;
            auVar8._4_4_ = auVar37._4_4_ * auVar33._4_4_;
            auVar8._0_4_ = auVar37._0_4_ * auVar33._0_4_;
            auVar8._8_4_ = auVar37._8_4_ * auVar33._8_4_;
            auVar8._12_4_ = auVar37._12_4_ * auVar33._12_4_;
            auVar8._16_4_ = auVar37._16_4_ * auVar33._0_4_;
            auVar8._20_4_ = auVar37._20_4_ * auVar33._4_4_;
            auVar8._24_4_ = auVar37._24_4_ * auVar33._8_4_;
            auVar8._28_4_ = auVar37._28_4_;
            auVar31 = vmaskmovps_avx(auVar50,auVar8);
            *(undefined1 (*) [32])(*pauVar13 + uVar23 * 4) = auVar31;
            uVar23 = uVar23 + 8;
          } while ((uVar12 + 8 & 0x1fffffff8) != uVar23);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar17);
    }
  }
  else if (iVar14 == 1) {
    iVar10 = iVar10 * iVar20;
    pp_Var2 = this->_vptr_PReLU_x86_fma;
    p_Var3 = pp_Var2[-3];
    pauVar13 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar4 = *(uint **)(&this->field_0xd8 + (long)p_Var3);
    if (*(int *)(&this->field_0xd0 + (long)p_Var3) < 2) {
      uVar17 = *puVar4;
      iVar14 = iVar10 + 7;
      if (-1 < iVar10) {
        iVar14 = iVar10;
      }
      uVar11 = iVar14 >> 3;
      if (7 < iVar10) {
        auVar28 = vshufps_avx(ZEXT416(uVar17),ZEXT416(uVar17),0);
        auVar24._16_16_ = auVar28;
        auVar24._0_16_ = auVar28;
        uVar19 = (ulong)uVar11;
        pauVar16 = pauVar13;
        do {
          auVar6 = vmaxps_avx(*pauVar16,ZEXT1632(ZEXT816(0) << 0x40));
          auVar31 = vminps_avx(*pauVar16,ZEXT1632(ZEXT816(0) << 0x40));
          auVar28 = vfmadd213ps_fma(auVar31,auVar24,auVar6);
          *pauVar16 = ZEXT1632(auVar28);
          pauVar16 = pauVar16 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar20 = iVar10 + uVar11 * -8;
      iVar14 = iVar20 + 3;
      if (-1 < iVar20) {
        iVar14 = iVar20;
      }
      auVar28 = ZEXT416(uVar17);
      if (3 < iVar20) {
        auVar41 = vshufps_avx(auVar28,auVar28,0);
        uVar19 = (ulong)(uint)(iVar14 >> 2);
        pauVar18 = (undefined1 (*) [16])(*pauVar13 + (long)(int)(uVar11 * 8) * 4);
        do {
          auVar26 = vmaxps_avx(*pauVar18,ZEXT816(0) << 0x40);
          auVar58 = vminps_avx(*pauVar18,ZEXT816(0) << 0x40);
          auVar26 = vfmadd213ps_fma(auVar58,auVar41,auVar26);
          *pauVar18 = auVar26;
          pauVar18 = pauVar18 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      auVar6 = _DAT_00515be0;
      auVar24 = _DAT_00515bc0;
      iVar14 = uVar11 * 8 + (iVar14 >> 2) * 4;
      if (iVar14 < iVar10) {
        lVar21 = (long)iVar14;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = (iVar10 - lVar21) - 1;
        auVar41 = vpshufd_avx(auVar41,0x44);
        auVar26 = vshufps_avx(auVar28,auVar28,0);
        uVar12 = 0;
        uVar19 = auVar41._0_8_;
        auVar27._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar27._8_4_ = auVar41._8_4_;
        uVar17 = auVar41._12_4_;
        auVar27._12_4_ = uVar17 ^ 0x80000000;
        auVar29._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar29._8_4_ = auVar27._8_4_;
        auVar29._12_4_ = uVar17 ^ 0x80000000;
        auVar28 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar32._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar32._8_4_ = auVar27._8_4_;
        auVar32._12_4_ = uVar17 ^ 0x80000000;
        auVar38._8_4_ = 0xffff;
        auVar38._0_8_ = 0xffff0000ffff;
        auVar38._12_4_ = 0xffff;
        auVar38._16_4_ = 0xffff;
        auVar38._20_4_ = 0xffff;
        auVar38._24_4_ = 0xffff;
        auVar38._28_4_ = 0xffff;
        do {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar12;
          auVar41 = vpshufd_avx(auVar39,0x44);
          auVar42._16_16_ = auVar41;
          auVar42._0_16_ = auVar41;
          auVar31 = vorps_avx(auVar42,auVar24);
          auVar37 = vorps_avx(auVar42,auVar6);
          auVar56._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
          auVar56._8_4_ = auVar37._24_4_;
          auVar56._12_4_ = auVar37._28_4_ ^ 0x80000000;
          auVar41 = vpcmpgtq_avx(auVar56,auVar27);
          auVar40._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
          auVar40._8_4_ = auVar37._8_4_;
          auVar40._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar40,auVar29);
          auVar41 = vpackssdw_avx(auVar58,auVar41);
          auVar57._0_8_ = auVar31._16_8_ ^ 0x8000000000000000;
          auVar57._8_4_ = auVar31._24_4_;
          auVar57._12_4_ = auVar31._28_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar57,auVar27);
          auVar48._0_8_ = auVar31._0_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar31._8_4_;
          auVar48._12_4_ = auVar31._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar48,auVar32);
          auVar58 = vpackssdw_avx(auVar35,auVar58);
          auVar41 = vpackssdw_avx(auVar58 ^ auVar28,auVar41 ^ auVar28);
          auVar58 = vpmovsxwd_avx(auVar41);
          auVar35 = vpunpckhwd_avx(auVar41,auVar41);
          auVar53._16_16_ = auVar35;
          auVar53._0_16_ = auVar58;
          auVar37 = vmaskmovps_avx(auVar53,*(undefined1 (*) [32])
                                            (*pauVar13 + uVar12 * 4 + lVar21 * 4));
          auVar31 = vcmpps_avx(auVar37,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar31 = vandps_avx(auVar31,auVar38);
          auVar58 = vpackusdw_avx(auVar31._0_16_,auVar31._16_16_);
          auVar41 = vpand_avx(auVar41,auVar58);
          auVar58 = vpmovzxwd_avx(auVar41);
          auVar58 = vpslld_avx(auVar58,0x1f);
          auVar41 = vpunpckhwd_avx(auVar41,auVar41);
          auVar41 = vpslld_avx(auVar41,0x1f);
          auVar43._16_16_ = auVar41;
          auVar43._0_16_ = auVar58;
          auVar9._4_4_ = auVar37._4_4_ * auVar26._4_4_;
          auVar9._0_4_ = auVar37._0_4_ * auVar26._0_4_;
          auVar9._8_4_ = auVar37._8_4_ * auVar26._8_4_;
          auVar9._12_4_ = auVar37._12_4_ * auVar26._12_4_;
          auVar9._16_4_ = auVar37._16_4_ * auVar26._0_4_;
          auVar9._20_4_ = auVar37._20_4_ * auVar26._4_4_;
          auVar9._24_4_ = auVar37._24_4_ * auVar26._8_4_;
          auVar9._28_4_ = auVar37._28_4_;
          auVar31 = vmaskmovps_avx(auVar43,auVar9);
          *(undefined1 (*) [32])(*pauVar13 + uVar12 * 4 + lVar21 * 4) = auVar31;
          uVar12 = uVar12 + 8;
        } while (((iVar10 - lVar21) + 7U & 0xfffffffffffffff8) != uVar12);
      }
    }
    else {
      iVar14 = iVar10 + 7;
      if (-1 < iVar10) {
        iVar14 = iVar10;
      }
      uVar17 = iVar14 >> 3;
      if (7 < iVar10) {
        uVar19 = (ulong)uVar17;
        lVar21 = 0;
        do {
          auVar24 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar13 + lVar21),ZEXT1632(ZEXT816(0)));
          auVar6 = vminps_avx(*(undefined1 (*) [32])(*pauVar13 + lVar21),ZEXT1632(ZEXT816(0)));
          auVar28 = vfmadd132ps_fma(auVar6,auVar24,*(undefined1 (*) [32])((long)puVar4 + lVar21));
          *(undefined1 (*) [32])(*pauVar13 + lVar21) = ZEXT1632(auVar28);
          lVar21 = lVar21 + 0x20;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar20 = iVar10 + uVar17 * -8;
      iVar14 = iVar20 + 3;
      if (-1 < iVar20) {
        iVar14 = iVar20;
      }
      if (3 < iVar20) {
        uVar19 = (ulong)(uint)(iVar14 >> 2);
        lVar21 = (long)(int)(uVar17 * 8) << 2;
        do {
          auVar28 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar13 + lVar21),ZEXT816(0) << 0x40);
          auVar41 = vminps_avx(*(undefined1 (*) [16])(*pauVar13 + lVar21),ZEXT816(0) << 0x40);
          auVar28 = vfmadd132ps_fma(auVar41,auVar28,*(undefined1 (*) [16])((long)puVar4 + lVar21));
          *(undefined1 (*) [16])(*pauVar13 + lVar21) = auVar28;
          lVar21 = lVar21 + 0x10;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar14 = uVar17 * 8 + (iVar14 >> 2) * 4;
      if (iVar14 < iVar10) {
        lVar21 = (long)iVar14;
        do {
          if (*(float *)(*pauVar13 + lVar21 * 4) < 0.0) {
            *(float *)(*pauVar13 + lVar21 * 4) =
                 *(float *)(*pauVar13 + lVar21 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var2[-3]) + lVar21 * 4);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < iVar10);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}